

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::openFile(Forth *this)

{
  byte bVar1;
  uint src;
  uint uVar2;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  ForthStack<unsigned_int> *this_00;
  exception *anon_var_0;
  ForthFile createdFile;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  undefined1 local_48 [8];
  string filename;
  openmode fam;
  size_t length;
  uint caddr;
  Forth *this_local;
  
  requireDStackDepth(this,3,"OPEN-FILE");
  this_00 = &this->dStack;
  src = ForthStack<unsigned_int>::getTop(this_00,2);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  filename.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  std::__cxx11::string::string((string *)local_48);
  moveFromDataSpace(this,(string *)local_48,src,(ulong)uVar2);
  __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(__p,(string *)local_48,filename.field_2._12_4_);
  std::shared_ptr<std::fstream>::shared_ptr<std::fstream,void>
            ((shared_ptr<std::fstream> *)
             &createdFile.fileObject.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&createdFile.fileObject.
                   super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    ForthStack<unsigned_int>::setTop(&this->dStack,1,0);
    ForthStack<unsigned_int>::setTop(&this->dStack,0xffffffbb);
  }
  else {
    anon_var_0._0_4_ = this->fileHandle + 1;
    this->fileHandle = (Cell)anon_var_0;
    anon_var_0._4_4_ = filename.field_2._12_4_;
    std::__cxx11::string::string
              ((string *)&createdFile,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::shared_ptr
              ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)
               ((long)&createdFile.fileName.field_2 + 8),
               (shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)
               &createdFile.fileObject.
                super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::push_back
              (&this->OpenFiles,(value_type *)&anon_var_0);
    ForthStack<unsigned_int>::setTop(&this->dStack,1,this->fileHandle);
    ForthStack<unsigned_int>::setTop(&this->dStack,0);
    ForthFile::~ForthFile((ForthFile *)&anon_var_0);
  }
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)
             &createdFile.fileObject.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void openFile() {
	REQUIRE_DSTACK_DEPTH(3, "OPEN-FILE");

	auto caddr = dStack.getTop(2);
	auto length = SIZE_T(dStack.getTop(1));
	auto fam = static_cast<std::ios_base::openmode>(dStack.getTop()); pop();

	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	try{
		std::shared_ptr<std::fstream> f{ new std::fstream(filename, fam) };
		if (f->is_open()) {
			//auto filesize = std::filesystem::file_size(filename);
			ForthFile createdFile{  ++fileHandle, fam,  filename, f };
			OpenFiles.push_back(createdFile);
			dStack.setTop(1, fileHandle);
			dStack.setTop(0);
		}
		else {
			dStack.setTop(1, 0);
			dStack.setTop(Cell(errorOpenFile));
		}
	}
	catch (std::exception &) {
		dStack.setTop(1, 0);
		dStack.setTop(Cell(errorOpenFile));
	}
}